

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::cast_from_variable_load
          (CompilerMSL *this,uint32_t source_id,string *expr,SPIRType *expr_type)

{
  uint uVar1;
  Variant *pVVar2;
  ulong uVar3;
  byte bVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ExecutionModel EVar8;
  uint uVar9;
  SPIRExpression *pSVar10;
  SPIRVariable *var;
  SPIRType *pSVar11;
  SPIRType *pSVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  char (*pacVar14) [4];
  BaseType expr_type_00;
  _Alloc_hider _Var15;
  SPIRType *in_R8;
  char (*in_R9) [2];
  string wrap_expr;
  undefined7 in_stack_fffffffffffffe18;
  string local_1d8;
  undefined1 local_1b8 [40];
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  uint *local_170;
  size_t local_168;
  uint local_158 [8];
  bool *local_138;
  size_t local_130;
  bool local_120 [40];
  TypedID<(spirv_cross::Types)1> *local_f8;
  size_t local_f0;
  TypedID<(spirv_cross::Types)1> local_e0 [8];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  uVar3 = (ulong)source_id;
  bVar4 = Compiler::has_extended_decoration
                    ((Compiler *)this,source_id,SPIRVCrossDecorationPhysicalTypePacked);
  if ((uVar3 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar3].type == TypeExpression)) {
    pSVar10 = Variant::get<spirv_cross::SPIRExpression>(pVVar2 + uVar3);
  }
  else {
    pSVar10 = (SPIRExpression *)0x0;
  }
  var = Compiler::maybe_get_backing_variable((Compiler *)this,source_id);
  uVar6 = Compiler::get_extended_decoration
                    ((Compiler *)this,source_id,SPIRVCrossDecorationPhysicalTypeID);
  pSVar11 = expr_type;
  if (uVar6 != 0) {
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + uVar6);
  }
  if (var == (SPIRVariable *)0x0) {
    bVar5 = Compiler::has_decoration((Compiler *)this,(ID)source_id,DecorationBuiltIn);
    if (!bVar5) {
      return;
    }
LAB_00238cc1:
    uVar7 = Compiler::get_decoration((Compiler *)this,(ID)source_id,DecorationBuiltIn);
    expr_type_00 = expr_type->basetype;
    uVar6 = expr_type->width;
    if (uVar7 < 0x2c) {
      if ((0xe103f100680U >> ((ulong)uVar7 & 0x3f) & 1) != 0) goto LAB_00238cf9;
      if ((0x1800UL >> ((ulong)uVar7 & 0x3f) & 1) == 0) goto LAB_0023904c;
      EVar8 = Compiler::get_execution_model((Compiler *)this);
      if (EVar8 == ExecutionModelTessellationControl) {
        expr_type_00 = Half;
        uVar6 = 0x10;
      }
      Compiler::is_array((Compiler *)this,expr_type);
LAB_00238eb8:
      if (expr_type_00 == expr_type->basetype) {
        return;
      }
      bVar5 = Compiler::is_array((Compiler *)this,expr_type);
      if ((uVar7 - 0xb < 2) && (bVar5)) {
        pacVar14 = (char (*) [4])0x0;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_1d8,this,expr_type)
        ;
        join<std::__cxx11::string,char_const(&)[4]>
                  ((string *)local_190,(spirv_cross *)&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"({ ",
                   pacVar14);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        bVar5 = Compiler::is_tessellating_triangles((Compiler *)this);
        uVar1 = (uint)(uVar7 != 0xc) * 2 + 2;
        if (bVar5) {
          uVar1 = (uint)(uVar7 != 0xc) * 2 + 1;
        }
        local_1b8._0_4_ = 0;
        do {
          if (uVar1 < 2) {
            join<char_const(&)[7],std::__cxx11::string&,char_const(&)[2]>
                      (&local_1d8,(spirv_cross *)"float(",(char (*) [7])expr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ba7f1
                       ,(char (*) [2])in_R8);
            ::std::__cxx11::string::_M_append(local_190,(ulong)local_1d8._M_dataplus._M_p);
          }
          else {
            in_R8 = (SPIRType *)local_1b8;
            join<char_const(&)[7],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                      (&local_1d8,(spirv_cross *)"float(",(char (*) [7])expr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be9ba
                       ,(char (*) [2])in_R8,(uint *)0x2d3e7f,
                       (char (*) [3])CONCAT17(bVar4,in_stack_fffffffffffffe18));
            ::std::__cxx11::string::_M_append(local_190,(ulong)local_1d8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p);
          }
          uVar9 = local_1b8._0_4_ + 1;
          if (uVar9 < uVar1) {
            ::std::__cxx11::string::append(local_190);
            uVar9 = local_1b8._0_4_ + 1;
          }
          local_1b8._0_4_ = uVar9;
        } while (uVar9 < uVar1);
        bVar5 = Compiler::is_tessellating_triangles((Compiler *)this);
        if (bVar5) {
          ::std::__cxx11::string::append(local_190);
        }
        ::std::__cxx11::string::append(local_190);
      }
      else {
        if (uVar6 != expr_type->width) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_1d8,this,expr_type,0);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                    ((string *)local_190,(spirv_cross *)&local_1d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d210e,
                     (char (*) [2])expr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ba7f1,
                     in_R9);
          goto LAB_002390da;
        }
        CompilerGLSL::bitcast_expression
                  ((string *)local_190,&this->super_CompilerGLSL,expr_type,expr_type_00,expr);
      }
    }
    else {
LAB_0023904c:
      if (((uVar7 - 0x1148 < 0x11) && ((0x10003U >> (uVar7 - 0x1148 & 0x1f) & 1) != 0)) ||
         (uVar7 == 0x1396)) {
LAB_00238cf9:
        uVar6 = 0x20;
        expr_type_00 = UInt;
      }
      bVar5 = Compiler::is_array((Compiler *)this,expr_type);
      if ((uVar7 != 0x14) || (!bVar5)) goto LAB_00238eb8;
      pacVar14 = (char (*) [4])0x0;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_1d8,this,expr_type);
      join<std::__cxx11::string,char_const(&)[4]>
                ((string *)local_190,(spirv_cross *)&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"({ ",pacVar14
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      pSVar11 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (expr_type->parent_type).id)
      ;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_1b8,this,pSVar11,0);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_1d8,(spirv_cross *)local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d210e,
                 (char (*) [2])expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ba7f1,in_R9
                );
      ::std::__cxx11::string::_M_append(local_190,(ulong)local_1d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if ((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != local_1b8 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_));
      }
      ::std::__cxx11::string::append(local_190);
    }
    ::std::__cxx11::string::operator=((string *)expr,(string *)local_190);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_190 + 0x10);
    local_1d8._M_dataplus._M_p = (pointer)local_190._0_8_;
  }
  else {
    source_id = (var->super_IVariant).self.id;
    local_1b8._32_8_ = pSVar10;
    pSVar12 = Compiler::get_variable_data_type((Compiler *)this,var);
    if ((expr_type->basetype == Boolean) &&
       ((var->storage == StorageClassWorkgroup || (pSVar12->basetype == Struct)))) {
      bVar5 = Compiler::is_array((Compiler *)this,expr_type);
      if (bVar5) {
        in_R8 = expr_type;
        CompilerGLSL::to_rerolled_array_expression
                  ((string *)local_190,&this->super_CompilerGLSL,expr_type,expr,expr_type);
        ::std::__cxx11::string::operator=((string *)expr,(string *)local_190);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_190 + 0x10);
        _Var15._M_p = (pointer)local_190._0_8_;
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_1d8,this,expr_type,0);
        in_R8 = (SPIRType *)0x2ba7f1;
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  ((string *)local_190,(spirv_cross *)&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d210e,
                   (char (*) [2])expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ba7f1,
                   in_R9);
        ::std::__cxx11::string::operator=((string *)expr,(string *)local_190);
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_);
        }
        paVar13 = &local_1d8.field_2;
        _Var15._M_p = local_1d8._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var15._M_p != paVar13) {
        operator_delete(_Var15._M_p);
      }
    }
    if ((this->msl_options).msl_version < 30000) {
      if (var->storage == StorageClassWorkgroup) {
        uVar1 = expr_type->columns;
      }
      else {
        if (((pSVar12->basetype != Struct) ||
            (bVar5 = Compiler::has_extended_decoration
                               ((Compiler *)this,(pSVar12->super_IVariant).self.id,
                                SPIRVCrossDecorationWorkgroupStruct), !bVar5)) ||
           (bVar4 = bVar4 ^ 1, bVar4 == 0)) goto LAB_00238ca6;
        uVar1 = expr_type->columns;
      }
      if (1 < uVar1) {
        SPIRType::SPIRType((SPIRType *)local_190,pSVar11);
        if (((SPIRExpression *)local_1b8._32_8_ != (SPIRExpression *)0x0) &&
           (*(bool *)(local_1b8._32_8_ + 0x39) == true)) {
          local_180._8_8_ = CONCAT44((int)local_180._8_8_,(int)((ulong)local_180._8_8_ >> 0x20));
        }
        local_168 = 0;
        local_130 = 0;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_1b8,this,local_190,0);
        in_R8 = (SPIRType *)0x2ba7f1;
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_1d8,(spirv_cross *)local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d210e,
                   (char (*) [2])expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ba7f1,
                   in_R9);
        ::std::__cxx11::string::operator=((string *)expr,(string *)&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != local_1b8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_));
        }
        local_190._0_8_ = &PTR__SPIRType_0035c188;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_68);
        local_b8 = 0;
        if (local_c0 != local_a8) {
          free(local_c0);
        }
        local_f0 = 0;
        if (local_f8 != (TypedID<(spirv_cross::Types)1> *)(local_190 + 0xb0)) {
          free(local_f8);
        }
        local_130 = 0;
        if (local_138 != (bool *)(local_190 + 0x70)) {
          free(local_138);
        }
        local_168 = 0;
        if (local_170 != (uint *)(local_190 + 0x38)) {
          free(local_170);
        }
      }
    }
LAB_00238ca6:
    bVar5 = Compiler::has_decoration((Compiler *)this,(ID)source_id,DecorationBuiltIn);
    if (bVar5) goto LAB_00238cc1;
    if (var->storage != StorageClassInput) {
      return;
    }
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr +
                         *(uint *)&(var->super_IVariant).field_0xc);
    if (pSVar11->basetype == Struct) {
      return;
    }
    if (expr_type->basetype == pSVar11->basetype) {
      return;
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_1d8,this,expr_type,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              ((string *)local_190,(spirv_cross *)&local_1d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d210e,
               (char (*) [2])expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ba7f1,in_R9);
LAB_002390da:
    ::std::__cxx11::string::operator=((string *)expr,(string *)local_190);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
    paVar13 = &local_1d8.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar13) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::cast_from_variable_load(uint32_t source_id, std::string &expr, const SPIRType &expr_type)
{
	bool is_packed = has_extended_decoration(source_id, SPIRVCrossDecorationPhysicalTypePacked);
	auto *source_expr = maybe_get<SPIRExpression>(source_id);
	auto *var = maybe_get_backing_variable(source_id);
	const SPIRType *var_type = nullptr, *phys_type = nullptr;

	if (uint32_t phys_id = get_extended_decoration(source_id, SPIRVCrossDecorationPhysicalTypeID))
		phys_type = &get<SPIRType>(phys_id);
	else
		phys_type = &expr_type;

	if (var)
	{
		source_id = var->self;
		var_type = &get_variable_data_type(*var);
	}

	bool rewrite_boolean_load =
	    expr_type.basetype == SPIRType::Boolean &&
	    (var && (var->storage == StorageClassWorkgroup || var_type->basetype == SPIRType::Struct));

	// Type fixups for workgroup variables if they are booleans.
	if (rewrite_boolean_load)
	{
		if (is_array(expr_type))
			expr = to_rerolled_array_expression(expr_type, expr, expr_type);
		else
			expr = join(type_to_glsl(expr_type), "(", expr, ")");
	}

	// Type fixups for workgroup variables if they are matrices.
	// Don't do fixup for packed types; those are handled specially.
	// FIXME: Maybe use a type like spvStorageMatrix for packed matrices?
	if (!msl_options.supports_msl_version(3, 0) && var &&
	    (var->storage == StorageClassWorkgroup ||
	     (var_type->basetype == SPIRType::Struct &&
	      has_extended_decoration(var_type->self, SPIRVCrossDecorationWorkgroupStruct) && !is_packed)) &&
	    expr_type.columns > 1)
	{
		SPIRType matrix_type = *phys_type;
		if (source_expr && source_expr->need_transpose)
			swap(matrix_type.vecsize, matrix_type.columns);
		matrix_type.array.clear();
		matrix_type.array_size_literal.clear();
		expr = join(type_to_glsl(matrix_type), "(", expr, ")");
	}

	// Only interested in standalone builtin variables in the switch below.
	if (!has_decoration(source_id, DecorationBuiltIn))
	{
		// If the backing variable does not match our expected sign, we can fix it up here.
		// See ensure_correct_input_type().
		if (var && var->storage == StorageClassInput)
		{
			auto &base_type = get<SPIRType>(var->basetype);
			if (base_type.basetype != SPIRType::Struct && expr_type.basetype != base_type.basetype)
				expr = join(type_to_glsl(expr_type), "(", expr, ")");
		}
		return;
	}

	auto builtin = static_cast<BuiltIn>(get_decoration(source_id, DecorationBuiltIn));
	auto expected_type = expr_type.basetype;
	auto expected_width = expr_type.width;
	switch (builtin)
	{
	case BuiltInGlobalInvocationId:
	case BuiltInLocalInvocationId:
	case BuiltInWorkgroupId:
	case BuiltInLocalInvocationIndex:
	case BuiltInWorkgroupSize:
	case BuiltInNumWorkgroups:
	case BuiltInLayer:
	case BuiltInViewportIndex:
	case BuiltInFragStencilRefEXT:
	case BuiltInPrimitiveId:
	case BuiltInSubgroupSize:
	case BuiltInSubgroupLocalInvocationId:
	case BuiltInViewIndex:
	case BuiltInVertexIndex:
	case BuiltInInstanceIndex:
	case BuiltInBaseInstance:
	case BuiltInBaseVertex:
	case BuiltInSampleMask:
		expected_type = SPIRType::UInt;
		expected_width = 32;
		break;

	case BuiltInTessLevelInner:
	case BuiltInTessLevelOuter:
		if (is_tesc_shader())
		{
			expected_type = SPIRType::Half;
			expected_width = 16;
		}
		break;

	default:
		break;
	}

	if (is_array(expr_type) && builtin == BuiltInSampleMask)
	{
		// Needs special handling.
		auto wrap_expr = join(type_to_glsl(expr_type), "({ ");
		wrap_expr += join(type_to_glsl(get<SPIRType>(expr_type.parent_type)), "(", expr, ")");
		wrap_expr += " })";
		expr = std::move(wrap_expr);
	}
	else if (expected_type != expr_type.basetype)
	{
		if (is_array(expr_type) && (builtin == BuiltInTessLevelInner || builtin == BuiltInTessLevelOuter))
		{
			// Triggers when loading TessLevel directly as an array.
			// Need explicit padding + cast.
			auto wrap_expr = join(type_to_glsl(expr_type), "({ ");

			uint32_t array_size = get_physical_tess_level_array_size(builtin);
			for (uint32_t i = 0; i < array_size; i++)
			{
				if (array_size > 1)
					wrap_expr += join("float(", expr, "[", i, "])");
				else
					wrap_expr += join("float(", expr, ")");
				if (i + 1 < array_size)
					wrap_expr += ", ";
			}

			if (is_tessellating_triangles())
				wrap_expr += ", 0.0";

			wrap_expr += " })";
			expr = std::move(wrap_expr);
		}
		else
		{
			// These are of different widths, so we cannot do a straight bitcast.
			if (expected_width != expr_type.width)
				expr = join(type_to_glsl(expr_type), "(", expr, ")");
			else
				expr = bitcast_expression(expr_type, expected_type, expr);
		}
	}
}